

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringmatcher.cpp
# Opt level: O1

QString * __thiscall QStringMatcher::pattern(QString *__return_storage_ptr__,QStringMatcher *this)

{
  long lVar1;
  Data *pDVar2;
  
  lVar1 = (this->q_pattern).d.size;
  if (lVar1 == 0) {
    QString::QString(__return_storage_ptr__,(QChar *)(this->q_sv).m_data,(this->q_sv).m_size);
  }
  else {
    pDVar2 = (this->q_pattern).d.d;
    (__return_storage_ptr__->d).d = pDVar2;
    (__return_storage_ptr__->d).ptr = (this->q_pattern).d.ptr;
    (__return_storage_ptr__->d).size = lVar1;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString QStringMatcher::pattern() const
{
    if (!q_pattern.isEmpty())
        return q_pattern;
    return q_sv.toString();
}